

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall mario::EPoller::updateChannel(EPoller *this,Channel *channel)

{
  int iVar1;
  Writer *pWVar2;
  mapped_type *ppCVar3;
  int local_90;
  int local_8c;
  int fd;
  undefined4 uStack_84;
  LogMessage *local_80;
  Level local_78;
  char *local_70;
  LineNumber local_68;
  char *local_60;
  VerboseLevel local_58;
  Logger *local_50;
  bool local_48;
  Logger *local_40;
  char *local_38;
  DispatchAction local_30;
  pointer local_28;
  pointer pbStack_20;
  pointer local_18;
  
  assertInLoopThread(this);
  _fd = &PTR__Writer_0012ce20;
  local_80 = (LogMessage *)0x0;
  local_78 = Info;
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp";
  local_68 = 0x3d;
  local_60 = "void mario::EPoller::updateChannel(Channel *)";
  local_58 = 0;
  local_50 = (Logger *)0x0;
  local_48 = false;
  local_40 = (Logger *)0x0;
  local_38 = "";
  local_30 = NormalLog;
  local_28 = (pointer)0x0;
  pbStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  pWVar2 = el::base::Writer::construct((Writer *)&fd,1,"default");
  pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [5])"fd= ");
  local_8c = channel->_fd;
  pWVar2 = el::base::Writer::operator<<(pWVar2,&local_8c);
  pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [12])", events = ");
  local_90 = channel->_events;
  el::base::Writer::operator<<(pWVar2,&local_90);
  el::base::Writer::~Writer((Writer *)&fd);
  iVar1 = channel->_index;
  if ((iVar1 == 2) || (iVar1 == -1)) {
    _fd = (undefined **)CONCAT44(uStack_84,channel->_fd);
    if (iVar1 == -1) {
      ppCVar3 = std::
                map<int,_mario::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
                ::operator[](&this->_channels,&fd);
      *ppCVar3 = channel;
    }
    channel->_index = 1;
    iVar1 = 1;
  }
  else {
    if (channel->_events == 0) {
      update(this,2,channel);
      channel->_index = 2;
      return;
    }
    iVar1 = 3;
  }
  update(this,iVar1,channel);
  return;
}

Assistant:

void EPoller::updateChannel(Channel* channel) {
    assertInLoopThread();
    LOG(INFO) << "fd= "<< channel->fd() << ", events = " << channel->events();
    const int index = channel->index();
    if (index == kNew || index == kDeleted) {
        int fd = channel->fd();
        if (index == kNew) {
            _channels[fd] = channel;
        }
        channel->setIndex(kAdded);
        update(EPOLL_CTL_ADD, channel);
    } else {
        int fd = channel->fd();
        if (channel->isNoneEvent()) {
            update(EPOLL_CTL_DEL, channel);
            channel->setIndex(kDeleted);
        } else {
            update(EPOLL_CTL_MOD, channel);
        }
    }
}